

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_types.cpp
# Opt level: O3

shared_ptr<duckdb::ExtraTypeInfo,_true> __thiscall
duckdb::ExtraTypeInfo::Deserialize(ExtraTypeInfo *this,Deserializer *deserializer)

{
  undefined8 uVar1;
  undefined1 auVar2 [8];
  ExtraTypeInfoType EVar3;
  uint uVar4;
  int iVar5;
  ExtraTypeInfo *pEVar6;
  SerializationException *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  ExtraTypeInfo *__tmp;
  shared_ptr<duckdb::ExtraTypeInfo,_true> sVar8;
  ExtraTypeInfoType type;
  type ret_1;
  string str;
  ExtraTypeInfoType local_89;
  shared_ptr<duckdb::ExtraTypeInfo,_true> local_88;
  undefined1 local_78 [16];
  undefined1 local_68 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_60;
  undefined1 local_58 [24];
  undefined8 local_40;
  undefined1 local_38 [24];
  
  (*deserializer->_vptr_Deserializer[2])(deserializer,100,"type");
  if (deserializer->deserialize_enum_from_string == true) {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_40,deserializer);
    EVar3 = EnumUtil::FromString<duckdb::ExtraTypeInfoType>((char *)local_40);
    uVar4 = (uint)EVar3;
    if ((undefined1 *)local_40 != local_38 + 8) {
      operator_delete((void *)local_40);
    }
  }
  else {
    uVar4 = (*deserializer->_vptr_Deserializer[0xf])(deserializer);
  }
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  local_89 = (ExtraTypeInfoType)uVar4;
  iVar5 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x65,"alias");
  if ((char)iVar5 == '\0') {
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
    local_40 = local_38 + 8;
    local_38[8] = FLAT_VECTOR;
    local_38._0_8_ =
         (tuple<duckdb::ExtensionTypeInfo_*,_std::default_delete<duckdb::ExtensionTypeInfo>_>)0x0;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_40,deserializer);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  Deserializer::ReadDeletedProperty<duckdb::vector<duckdb::Value,true>>
            (deserializer,0x66,"modifiers");
  iVar5 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x67,"extension_info");
  if ((char)iVar5 == '\0') {
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
    local_78._0_8_ = (pointer)0x0;
    _Var7._M_pi = extraout_RDX_00;
  }
  else {
    Deserializer::
    Read<duckdb::unique_ptr<duckdb::ExtensionTypeInfo,std::default_delete<duckdb::ExtensionTypeInfo>,true>,duckdb::ExtensionTypeInfo>
              ((Deserializer *)local_78);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
    _Var7._M_pi = extraout_RDX;
  }
  local_88.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
  _0_4_ = 0;
  local_88.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
  _4_4_ = 0;
  local_88.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 0;
  local_88.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = 0;
  local_88.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (ExtraTypeInfo *)0x0;
  local_88.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  switch(uVar4 & 0xff) {
  case 0:
    goto switchD_010ad4e4_caseD_0;
  case 1:
    local_68 = (undefined1  [8])0x0;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<duckdb::ExtraTypeInfo,std::allocator<duckdb::ExtraTypeInfo>,duckdb::ExtraTypeInfoType&>
              (&_Stack_60,(ExtraTypeInfo **)local_68,
               (allocator<duckdb::ExtraTypeInfo> *)(local_78 + 0xf),&local_89);
    auVar2 = local_68;
    pEVar6 = (ExtraTypeInfo *)local_68;
    if (_Stack_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (_Stack_60._M_pi)->_M_use_count = (_Stack_60._M_pi)->_M_use_count + 1;
        UNLOCK();
        if (_Stack_60._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
        goto LAB_010ad676;
      }
      else {
        (_Stack_60._M_pi)->_M_use_count = (_Stack_60._M_pi)->_M_use_count + 1;
      }
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_60._M_pi);
    }
LAB_010ad676:
    _Var7._M_pi = local_88.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
    local_88.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)auVar2;
    local_88.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = _Stack_60._M_pi;
    if (_Var7._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var7._M_pi);
    }
    goto LAB_010ad5d7;
  case 2:
    DecimalTypeInfo::Deserialize((DecimalTypeInfo *)local_68,deserializer);
    break;
  case 3:
    StringTypeInfo::Deserialize((StringTypeInfo *)local_68,deserializer);
    break;
  case 4:
    ListTypeInfo::Deserialize((ListTypeInfo *)local_68,deserializer);
    break;
  case 5:
    StructTypeInfo::Deserialize((StructTypeInfo *)local_68,deserializer);
    break;
  case 6:
    EnumTypeInfo::Deserialize((EnumTypeInfo *)local_68,deserializer);
    break;
  case 7:
    UserTypeInfo::Deserialize((UserTypeInfo *)local_68,deserializer);
    break;
  case 8:
    AggregateStateTypeInfo::Deserialize((AggregateStateTypeInfo *)local_68,deserializer);
    break;
  case 9:
    ArrayTypeInfo::Deserialize((ArrayTypeInfo *)local_68,deserializer);
    break;
  case 10:
    AnyTypeInfo::Deserialize((AnyTypeInfo *)local_68,deserializer);
    break;
  case 0xb:
    IntegerLiteralTypeInfo::Deserialize((IntegerLiteralTypeInfo *)local_68,deserializer);
    break;
  default:
    this_00 = (SerializationException *)__cxa_allocate_exception(0x10);
    local_68 = (undefined1  [8])local_58;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_68,"Unsupported type for deserialization of ExtraTypeInfo!","");
    SerializationException::SerializationException(this_00,(string *)local_68);
    __cxa_throw(this_00,&SerializationException::typeinfo,::std::runtime_error::~runtime_error);
  }
  local_88.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_68;
  local_88.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Stack_60._M_pi;
LAB_010ad5d7:
  pEVar6 = shared_ptr<duckdb::ExtraTypeInfo,_true>::operator->(&local_88);
  ::std::__cxx11::string::operator=((string *)&pEVar6->alias,(string *)&local_40);
  pEVar6 = shared_ptr<duckdb::ExtraTypeInfo,_true>::operator->(&local_88);
  uVar1 = local_78._0_8_;
  local_78._0_8_ = (pointer)0x0;
  std::__uniq_ptr_impl<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>::
  reset((__uniq_ptr_impl<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>
         *)&pEVar6->extension_info,(pointer)uVar1);
  _Var7._M_pi = extraout_RDX_01;
switchD_010ad4e4_caseD_0:
  uVar1 = local_78._0_8_;
  *(undefined4 *)&this->_vptr_ExtraTypeInfo =
       local_88.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr._0_4_;
  *(undefined4 *)((long)&this->_vptr_ExtraTypeInfo + 4) =
       local_88.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr._4_4_;
  *(undefined4 *)&this->type =
       local_88.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi._0_4_;
  *(undefined4 *)&this->field_0xc =
       local_88.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi._4_4_;
  if ((pointer)local_78._0_8_ != (pointer)0x0) {
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)(local_78._0_8_ + 0x18));
    std::vector<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_>::~vector
              ((vector<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_> *)
               uVar1);
    operator_delete((void *)uVar1);
    _Var7._M_pi = extraout_RDX_02;
  }
  if ((undefined1 *)local_40 != local_38 + 8) {
    operator_delete((void *)local_40);
    _Var7._M_pi = extraout_RDX_03;
  }
  sVar8.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var7._M_pi;
  sVar8.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this
  ;
  return (shared_ptr<duckdb::ExtraTypeInfo,_true>)
         sVar8.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<ExtraTypeInfo> ExtraTypeInfo::Deserialize(Deserializer &deserializer) {
	auto type = deserializer.ReadProperty<ExtraTypeInfoType>(100, "type");
	auto alias = deserializer.ReadPropertyWithDefault<string>(101, "alias");
	deserializer.ReadDeletedProperty<vector<Value>>(102, "modifiers");
	auto extension_info = deserializer.ReadPropertyWithDefault<unique_ptr<ExtensionTypeInfo>>(103, "extension_info");
	shared_ptr<ExtraTypeInfo> result;
	switch (type) {
	case ExtraTypeInfoType::AGGREGATE_STATE_TYPE_INFO:
		result = AggregateStateTypeInfo::Deserialize(deserializer);
		break;
	case ExtraTypeInfoType::ANY_TYPE_INFO:
		result = AnyTypeInfo::Deserialize(deserializer);
		break;
	case ExtraTypeInfoType::ARRAY_TYPE_INFO:
		result = ArrayTypeInfo::Deserialize(deserializer);
		break;
	case ExtraTypeInfoType::DECIMAL_TYPE_INFO:
		result = DecimalTypeInfo::Deserialize(deserializer);
		break;
	case ExtraTypeInfoType::ENUM_TYPE_INFO:
		result = EnumTypeInfo::Deserialize(deserializer);
		break;
	case ExtraTypeInfoType::GENERIC_TYPE_INFO:
		result = make_shared_ptr<ExtraTypeInfo>(type);
		break;
	case ExtraTypeInfoType::INTEGER_LITERAL_TYPE_INFO:
		result = IntegerLiteralTypeInfo::Deserialize(deserializer);
		break;
	case ExtraTypeInfoType::INVALID_TYPE_INFO:
		return nullptr;
	case ExtraTypeInfoType::LIST_TYPE_INFO:
		result = ListTypeInfo::Deserialize(deserializer);
		break;
	case ExtraTypeInfoType::STRING_TYPE_INFO:
		result = StringTypeInfo::Deserialize(deserializer);
		break;
	case ExtraTypeInfoType::STRUCT_TYPE_INFO:
		result = StructTypeInfo::Deserialize(deserializer);
		break;
	case ExtraTypeInfoType::USER_TYPE_INFO:
		result = UserTypeInfo::Deserialize(deserializer);
		break;
	default:
		throw SerializationException("Unsupported type for deserialization of ExtraTypeInfo!");
	}
	result->alias = std::move(alias);
	result->extension_info = std::move(extension_info);
	return result;
}